

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O1

idx_t duckdb::TernaryExecutor::
      SelectLoop<duckdb::interval_t,duckdb::interval_t,duckdb::interval_t,duckdb::UpperInclusiveBetweenOperator,false,true,true>
                (interval_t *adata,interval_t *bdata,interval_t *cdata,SelectionVector *result_sel,
                idx_t count,SelectionVector *asel,SelectionVector *bsel,SelectionVector *csel,
                ValidityMask *avalidity,ValidityMask *bvalidity,ValidityMask *cvalidity,
                SelectionVector *true_sel,SelectionVector *false_sel)

{
  sel_t *psVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  unsigned_long *puVar5;
  unsigned_long *puVar6;
  unsigned_long *puVar7;
  sel_t *psVar8;
  sel_t *psVar9;
  bool bVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  int64_t lmicros;
  long lVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  idx_t iVar20;
  long lVar21;
  int64_t lmonths;
  long lVar22;
  long lVar23;
  int64_t ldays;
  long lVar24;
  
  if (count == 0) {
    iVar20 = 0;
  }
  else {
    psVar1 = result_sel->sel_vector;
    psVar2 = asel->sel_vector;
    psVar3 = bsel->sel_vector;
    psVar4 = csel->sel_vector;
    puVar5 = (avalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    puVar6 = (bvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    puVar7 = (cvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    psVar8 = true_sel->sel_vector;
    psVar9 = false_sel->sel_vector;
    iVar20 = 0;
    lVar18 = 0;
    uVar19 = 0;
    do {
      uVar17 = uVar19;
      if (psVar1 != (sel_t *)0x0) {
        uVar17 = (ulong)psVar1[uVar19];
      }
      uVar11 = uVar19;
      if (psVar2 != (sel_t *)0x0) {
        uVar11 = (ulong)psVar2[uVar19];
      }
      uVar12 = uVar19;
      if (psVar3 != (sel_t *)0x0) {
        uVar12 = (ulong)psVar3[uVar19];
      }
      uVar15 = uVar19;
      if (psVar4 != (sel_t *)0x0) {
        uVar15 = (ulong)psVar4[uVar19];
      }
      if ((((puVar5 == (unsigned_long *)0x0) || ((puVar5[uVar11 >> 6] >> (uVar11 & 0x3f) & 1) != 0))
          && ((puVar6 == (unsigned_long *)0x0 || ((puVar6[uVar12 >> 6] >> (uVar12 & 0x3f) & 1) != 0)
              ))) &&
         ((puVar7 == (unsigned_long *)0x0 || ((puVar7[uVar15 >> 6] >> (uVar15 & 0x3f) & 1) != 0))))
      {
        lVar14._0_4_ = adata[uVar11].months;
        lVar14._4_4_ = adata[uVar11].days;
        lVar21._0_4_ = bdata[uVar12].months;
        lVar21._4_4_ = bdata[uVar12].days;
        lVar13 = (lVar14 >> 0x20) + adata[uVar11].micros / 86400000000;
        lVar16 = adata[uVar11].micros % 86400000000;
        lVar24 = lVar13 % 0x1e;
        lVar22 = (long)(int)(undefined4)lVar14 + lVar13 / 0x1e;
        lVar23 = (lVar21 >> 0x20) + bdata[uVar12].micros / 86400000000;
        lVar13._0_4_ = cdata[uVar15].months;
        lVar13._4_4_ = cdata[uVar15].days;
        lVar14 = (long)(int)(undefined4)lVar21 + lVar23 / 0x1e;
        if (lVar22 <= lVar14) {
          if (lVar14 <= lVar22) {
            lVar23 = lVar23 % 0x1e;
            if ((lVar23 < lVar24) ||
               ((bVar10 = false, lVar23 <= lVar24 && (bdata[uVar12].micros % 86400000000 < lVar16)))
               ) goto LAB_003eaa31;
            goto LAB_003eaaba;
          }
          goto LAB_003eaab8;
        }
LAB_003eaa31:
        lVar14 = (lVar13 >> 0x20) + cdata[uVar15].micros / 86400000000;
        lVar21 = lVar14 % 0x1e;
        lVar14 = (long)(int)(undefined4)lVar13 + lVar14 / 0x1e;
        if (lVar14 < lVar22) goto LAB_003eaab8;
        bVar10 = true;
        if (lVar14 <= lVar22) {
          if (lVar21 < lVar24) goto LAB_003eaab8;
          bVar10 = lVar16 <= cdata[uVar15].micros % 86400000000 || lVar24 < lVar21;
        }
      }
      else {
LAB_003eaab8:
        bVar10 = false;
      }
LAB_003eaaba:
      psVar8[iVar20] = (sel_t)uVar17;
      iVar20 = iVar20 + bVar10;
      psVar9[lVar18] = (sel_t)uVar17;
      lVar18 = lVar18 + (ulong)(bVar10 ^ 1);
      uVar19 = uVar19 + 1;
    } while (count != uVar19);
  }
  return iVar20;
}

Assistant:

static inline idx_t SelectLoop(const A_TYPE *__restrict adata, const B_TYPE *__restrict bdata,
	                               const C_TYPE *__restrict cdata, const SelectionVector *result_sel, idx_t count,
	                               const SelectionVector &asel, const SelectionVector &bsel,
	                               const SelectionVector &csel, ValidityMask &avalidity, ValidityMask &bvalidity,
	                               ValidityMask &cvalidity, SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		for (idx_t i = 0; i < count; i++) {
			auto result_idx = result_sel->get_index(i);
			auto aidx = asel.get_index(i);
			auto bidx = bsel.get_index(i);
			auto cidx = csel.get_index(i);
			bool comparison_result =
			    (NO_NULL || (avalidity.RowIsValid(aidx) && bvalidity.RowIsValid(bidx) && cvalidity.RowIsValid(cidx))) &&
			    OP::Operation(adata[aidx], bdata[bidx], cdata[cidx]);
			if (HAS_TRUE_SEL) {
				true_sel->set_index(true_count, result_idx);
				true_count += comparison_result;
			}
			if (HAS_FALSE_SEL) {
				false_sel->set_index(false_count, result_idx);
				false_count += !comparison_result;
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}